

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<signed_char,short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_00;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_01;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_02;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_05;
  short u2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  char t;
  short u;
  undefined6 in_stack_ffffffffffffff28;
  short in_stack_ffffffffffffff2e;
  undefined4 in_stack_ffffffffffffff30;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff34;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff39;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff46;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff47;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_8 [2]
  ;
  byte local_4;
  char local_3;
  short local_2;
  
  local_2 = 0;
  local_3 = 0;
  local_4 = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<short>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_stack_ffffffffffffff37,
                             CONCAT16(in_stack_ffffffffffffff36.m_int,
                                      CONCAT24(in_stack_ffffffffffffff34.m_int,
                                               in_stack_ffffffffffffff30))),
                 (short *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (local_8,&local_2);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<short>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                             CONCAT16(in_stack_ffffffffffffff46.m_int,
                                      CONCAT15(in_stack_ffffffffffffff45,
                                               CONCAT14(in_stack_ffffffffffffff44,
                                                        CONCAT13(in_stack_ffffffffffffff43,
                                                                 CONCAT12(in_stack_ffffffffffffff42,
                                                                          in_stack_ffffffffffffff40)
                                                                ))))),
                 (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  local_4 = (local_4 ^ 0xff) & 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(char *)CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,
                                       CONCAT24(in_stack_ffffffffffffff3c,
                                                CONCAT13(in_stack_ffffffffffffff3b,
                                                         CONCAT12(in_stack_ffffffffffffff3a,
                                                                  CONCAT11(in_stack_ffffffffffffff39
                                                                           ,
                                                  in_stack_ffffffffffffff38)))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(short *)CONCAT17(in_stack_ffffffffffffff3f,
                               CONCAT16(in_stack_ffffffffffffff3e,
                                        CONCAT24(in_stack_ffffffffffffff3c,
                                                 CONCAT13(in_stack_ffffffffffffff3b,
                                                          CONCAT12(in_stack_ffffffffffffff3a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff39,
                                                  in_stack_ffffffffffffff38)))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36.m_int,
                                 CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)
                                )),
            (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  SafeInt::operator_cast_to_short
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator*(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs.m_int._1_1_ = in_stack_ffffffffffffff37;
  rhs.m_int._0_1_ = in_stack_ffffffffffffff36.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),rhs);
  local_2 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                         CONCAT16(in_stack_ffffffffffffff46.m_int,
                                  CONCAT15(in_stack_ffffffffffffff45,
                                           CONCAT14(in_stack_ffffffffffffff44,
                                                    CONCAT13(in_stack_ffffffffffffff43,
                                                             CONCAT12(in_stack_ffffffffffffff42,
                                                                      in_stack_ffffffffffffff40)))))
                        ),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs_00.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_00.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_00);
  local_2 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator/(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff36);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  i.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  i.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),i);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator+(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs_01.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_01.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_01);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  local_2 = 0;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator-(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                        CONCAT16(in_stack_ffffffffffffff46.m_int,
                                 CONCAT15(in_stack_ffffffffffffff45,
                                          CONCAT14(in_stack_ffffffffffffff44,
                                                   CONCAT13(in_stack_ffffffffffffff43,
                                                            CONCAT12(in_stack_ffffffffffffff42,
                                                                     in_stack_ffffffffffffff40))))))
            ,(int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                         CONCAT16(in_stack_ffffffffffffff46.m_int,
                                  CONCAT15(in_stack_ffffffffffffff45,
                                           CONCAT14(in_stack_ffffffffffffff44,
                                                    CONCAT13(in_stack_ffffffffffffff43,
                                                             CONCAT12(in_stack_ffffffffffffff42,
                                                                      in_stack_ffffffffffffff40)))))
                        ),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  rhs_02.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_02.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_02);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff47.m_int,
                         CONCAT16(in_stack_ffffffffffffff46.m_int,
                                  CONCAT15(in_stack_ffffffffffffff45,
                                           CONCAT14(in_stack_ffffffffffffff44,
                                                    CONCAT13(in_stack_ffffffffffffff43,
                                                             CONCAT12(in_stack_ffffffffffffff42,
                                                                      in_stack_ffffffffffffff40)))))
                        ),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),CONCAT11(in_stack_ffffffffffffff37,in_stack_ffffffffffffff36.m_int));
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  bits.m_int._1_1_ = in_stack_ffffffffffffff45;
  bits.m_int._0_1_ = in_stack_ffffffffffffff44;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),bits);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator<<((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36.m_int,
                                   CONCAT24(in_stack_ffffffffffffff34.m_int,
                                            in_stack_ffffffffffffff30))),in_stack_ffffffffffffff2e);
  bits_01.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  bits_01.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,
                                            CONCAT13(in_stack_ffffffffffffff3b,
                                                     CONCAT12(in_stack_ffffffffffffff3a,
                                                              CONCAT11(in_stack_ffffffffffffff39,
                                                                       in_stack_ffffffffffffff38))))
                                  )),bits_01);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),CONCAT11(in_stack_ffffffffffffff37,in_stack_ffffffffffffff36.m_int));
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  bits_00.m_int._1_1_ = in_stack_ffffffffffffff45;
  bits_00.m_int._0_1_ = in_stack_ffffffffffffff44;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),bits_00);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator>>((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36.m_int,
                                   CONCAT24(in_stack_ffffffffffffff34.m_int,
                                            in_stack_ffffffffffffff30))),in_stack_ffffffffffffff2e);
  bits_02.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  bits_02.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,
                                            CONCAT13(in_stack_ffffffffffffff3b,
                                                     CONCAT12(in_stack_ffffffffffffff3a,
                                                              CONCAT11(in_stack_ffffffffffffff39,
                                                                       in_stack_ffffffffffffff38))))
                                  )),bits_02);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            CONCAT11(in_stack_ffffffffffffff39,
                                                                     in_stack_ffffffffffffff38))))))
            ,in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator&((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),in_stack_ffffffffffffff47);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs_03.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_03.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_03);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),
            in_stack_ffffffffffffff36);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator|((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),in_stack_ffffffffffffff47);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs_04.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_04.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_04);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),
            in_stack_ffffffffffffff36);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  operator^((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36.m_int,
                                            CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                     in_stack_ffffffffffffff30))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),in_stack_ffffffffffffff47);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36.m_int,
                                  CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30
                                          ))),in_stack_ffffffffffffff2e);
  rhs_05.m_int._1_1_ = in_stack_ffffffffffffff47.m_int;
  rhs_05.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT13(in_stack_ffffffffffffff3b,
                                                    CONCAT12(in_stack_ffffffffffffff3a,
                                                             CONCAT11(in_stack_ffffffffffffff39,
                                                                      in_stack_ffffffffffffff38)))))
                        ),rhs_05);
  local_4 = operator<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_4 = operator<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,0);
  local_4 = operator<(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         )0x0);
  local_4 = operator<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_4 = operator<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_4 = operator<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_4 = operator<=(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  local_4 = operator<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_4 = operator>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_4 = operator>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,0);
  local_4 = operator>(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         )0x0);
  local_4 = operator>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_4 = operator>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_4 = operator>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_4 = operator>=(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  local_4 = operator>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_4 = operator==((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_4 = operator==((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_4 = operator==(0,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  operator==((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    )0x0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}